

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMReader.cc
# Opt level: O2

void __thiscall OpenMesh::IO::_OMReader_::_OMReader_(_OMReader_ *this)

{
  _IOManager_ *this_00;
  
  (this->super_BaseReader)._vptr_BaseReader = (_func_int **)&PTR___OMReader__001eb160;
  (this->fileOptions_).flags_ = 0;
  (this->property_name_).super_string._M_dataplus._M_p =
       (pointer)&(this->property_name_).super_string.field_2;
  (this->property_name_).super_string._M_string_length = 0;
  (this->property_name_).super_string.field_2._M_local_buf[0] = '\0';
  this_00 = IOManager();
  _IOManager_::register_module(this_00,&this->super_BaseReader);
  return;
}

Assistant:

_OMReader_::_OMReader_()
{
  IOManager().register_module(this);
}